

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

Curl_multi * Curl_multi_handle(size_t hashsize,size_t chashsize,size_t dnssize)

{
  int iVar1;
  Curl_multi *multi;
  
  multi = (Curl_multi *)(*Curl_ccalloc)(1,0x280);
  if (multi != (Curl_multi *)0x0) {
    multi->magic = 0xbab1e;
    Curl_init_dnscache(&multi->hostcache,dnssize);
    Curl_hash_init(&multi->sockhash,hashsize,hash_fd,fd_key_compare,sh_freeentry);
    Curl_hash_init(&multi->proto_hash,0x17,Curl_hash_str,Curl_str_key_compare,ph_freeentry);
    iVar1 = Curl_cpool_init(&multi->cpool,Curl_on_disconnect,multi,(Curl_share *)0x0,chashsize);
    if (iVar1 == 0) {
      Curl_llist_init(&multi->msglist,(Curl_llist_dtor)0x0);
      Curl_llist_init(&multi->process,(Curl_llist_dtor)0x0);
      Curl_llist_init(&multi->pending,(Curl_llist_dtor)0x0);
      Curl_llist_init(&multi->msgsent,(Curl_llist_dtor)0x0);
      multi->field_0x279 = multi->field_0x279 | 1;
      multi->max_concurrent_streams = 100;
      multi->last_timeout_ms = -1;
      iVar1 = Curl_pipe(multi->wakeup_pair,true);
      if (-1 < iVar1) {
        return multi;
      }
      multi->wakeup_pair[0] = -1;
      multi->wakeup_pair[1] = -1;
      return multi;
    }
    sockhash_destroy(&multi->sockhash);
    Curl_hash_destroy(&multi->proto_hash);
    Curl_hash_destroy(&multi->hostcache);
    Curl_cpool_destroy(&multi->cpool);
    (*Curl_cfree)(multi);
  }
  return (Curl_multi *)0x0;
}

Assistant:

struct Curl_multi *Curl_multi_handle(size_t hashsize, /* socket hash */
                                     size_t chashsize, /* connection hash */
                                     size_t dnssize) /* dns hash */
{
  struct Curl_multi *multi = calloc(1, sizeof(struct Curl_multi));

  if(!multi)
    return NULL;

  multi->magic = CURL_MULTI_HANDLE;

  Curl_init_dnscache(&multi->hostcache, dnssize);

  sh_init(&multi->sockhash, hashsize);

  Curl_hash_init(&multi->proto_hash, 23,
                 Curl_hash_str, Curl_str_key_compare, ph_freeentry);

  if(Curl_cpool_init(&multi->cpool, Curl_on_disconnect,
                         multi, NULL, chashsize))
    goto error;

  Curl_llist_init(&multi->msglist, NULL);
  Curl_llist_init(&multi->process, NULL);
  Curl_llist_init(&multi->pending, NULL);
  Curl_llist_init(&multi->msgsent, NULL);

  multi->multiplexing = TRUE;
  multi->max_concurrent_streams = 100;
  multi->last_timeout_ms = -1;

#ifdef USE_WINSOCK
  multi->wsa_event = WSACreateEvent();
  if(multi->wsa_event == WSA_INVALID_EVENT)
    goto error;
#else
#ifdef ENABLE_WAKEUP
  if(wakeup_create(multi->wakeup_pair, TRUE) < 0) {
    multi->wakeup_pair[0] = CURL_SOCKET_BAD;
    multi->wakeup_pair[1] = CURL_SOCKET_BAD;
  }
#endif
#endif

  return multi;

error:

  sockhash_destroy(&multi->sockhash);
  Curl_hash_destroy(&multi->proto_hash);
  Curl_hash_destroy(&multi->hostcache);
  Curl_cpool_destroy(&multi->cpool);
  free(multi);
  return NULL;
}